

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall
ByteData160_ByteDataConstructor_Test::TestBody(ByteData160_ByteDataConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  char *in_R9;
  AssertHelper local_210;
  Message local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_200;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_2;
  Message local_1b8 [2];
  ByteData local_1a8;
  undefined1 local_190 [8];
  ByteData byte_class_data;
  Message local_170;
  ByteData local_168;
  string local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_100;
  Message local_f8;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_;
  Message local_d0;
  string local_c8;
  string local_a8;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ByteData160 byte_data;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData data;
  ByteData160_ByteDataConstructor_Test *this_local;
  
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"1234567890123456789012345678901234567890",&local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::ByteData160::ByteData160((ByteData160 *)&gtest_ar.message_,(ByteData *)local_28);
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_a8,(ByteData160 *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_c8,(ByteData *)local_28);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_88,"byte_data.GetHex().c_str()","data.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  bVar1 = cfd::core::ByteData160::IsEmpty((ByteData160 *)&gtest_ar.message_);
  local_e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_e8,
               (AssertionResult *)"byte_data.IsEmpty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  cfd::core::ByteData160::Serialize(&local_168,(ByteData160 *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_150,&local_168);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_130,"byte_data.Serialize().GetHex().c_str()",
             "\"141234567890123456789012345678901234567890\"",pcVar2,
             "141234567890123456789012345678901234567890");
  std::__cxx11::string::~string((string *)&local_150);
  cfd::core::ByteData::~ByteData(&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &byte_class_data.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &byte_class_data.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_170);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &byte_class_data.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  cfd::core::ByteData::ByteData((ByteData *)local_190);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData160::GetData(&local_1a8,(ByteData160 *)&gtest_ar.message_);
      cfd::core::ByteData::operator=((ByteData *)local_190,&local_1a8);
      cfd::core::ByteData::~ByteData(&local_1a8);
    }
  }
  else {
    testing::Message::Message(local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x4a,
               "Expected: byte_class_data = byte_data.GetData() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_1b8);
  }
  cfd::core::ByteData160::GetBytes(&local_1e8,(ByteData160 *)&gtest_ar.message_);
  cfd::core::ByteData::GetBytes(&local_200,(ByteData *)local_190);
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_1d0,"byte_data.GetBytes()","byte_class_data.GetBytes()",
             &local_1e8,&local_200);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_200);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  cfd::core::ByteData::~ByteData((ByteData *)local_190);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)&gtest_ar.message_);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(ByteData160, ByteDataConstructor) {
  ByteData data("1234567890123456789012345678901234567890");
  ByteData160 byte_data = ByteData160(data);

  EXPECT_STREQ(byte_data.GetHex().c_str(), data.GetHex().c_str());
  EXPECT_FALSE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "141234567890123456789012345678901234567890");
  ByteData byte_class_data;
  EXPECT_NO_THROW(byte_class_data = byte_data.GetData());
  EXPECT_EQ(byte_data.GetBytes(), byte_class_data.GetBytes());
}